

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t2cod.c
# Opt level: O3

jpc_pi_t * jpc_pi_create0(void)

{
  jpc_pi_t *ptr;
  jpc_pchglist_t *pjVar1;
  
  ptr = (jpc_pi_t *)jas_malloc(0xb8);
  if (ptr != (jpc_pi_t *)0x0) {
    ptr->picomps = (jpc_picomp_t *)0x0;
    ptr->pchgno = 0;
    pjVar1 = (jpc_pchglist_t *)jas_malloc(0x10);
    if (pjVar1 != (jpc_pchglist_t *)0x0) {
      pjVar1->numpchgs = 0;
      pjVar1->maxpchgs = 0;
      pjVar1->pchgs = (jpc_pchg_t **)0x0;
      ptr->pchglist = pjVar1;
      return ptr;
    }
    ptr->pchglist = (jpc_pchglist_t *)0x0;
    jas_free(ptr);
  }
  return (jpc_pi_t *)0x0;
}

Assistant:

jpc_pi_t *jpc_pi_create0()
{
	jpc_pi_t *pi;
	if (!(pi = jas_malloc(sizeof(jpc_pi_t)))) {
		return 0;
	}
	pi->picomps = 0;
	pi->pchgno = 0;
	if (!(pi->pchglist = jpc_pchglist_create())) {
		jas_free(pi);
		return 0;
	}
	return pi;
}